

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_set_xy(secp256k1_ge *r,secp256k1_fe *x,secp256k1_fe *y)

{
  secp256k1_fe *in_RDX;
  secp256k1_fe *in_RSI;
  secp256k1_ge *in_RDI;
  
  secp256k1_fe_verify(in_RSI);
  secp256k1_fe_verify(in_RDX);
  in_RDI->infinity = 0;
  memcpy(in_RDI,in_RSI,0x28);
  memcpy(&in_RDI->y,in_RDX,0x28);
  secp256k1_ge_verify(in_RDI);
  return;
}

Assistant:

static void secp256k1_ge_set_xy(secp256k1_ge *r, const secp256k1_fe *x, const secp256k1_fe *y) {
    secp256k1_fe_verify(x);
    secp256k1_fe_verify(y);
    r->infinity = 0;
    r->x = *x;
    r->y = *y;
    secp256k1_ge_verify(r);
}